

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplekey.cpp
# Opt level: O3

void __thiscall YAML::Scanner::InsertPotentialSimpleKey(Scanner *this)

{
  iterator *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Map_pointer ppFVar3;
  _Elt_pointer pSVar4;
  bool bVar5;
  _Elt_pointer pTVar6;
  SimpleKey key;
  SimpleKey local_a0;
  Token local_70;
  
  if (this->m_simpleKeyAllowed == true) {
    bVar5 = ExistsActiveSimpleKey(this);
    if (!bVar5) {
      local_70.status = (this->INPUT).m_mark.pos;
      local_70.type = (this->INPUT).m_mark.line;
      local_70.mark.pos = (this->INPUT).m_mark.column;
      ppFVar3 = (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      SimpleKey::SimpleKey
                (&local_a0,(Mark *)&local_70,
                 ((long)(this->m_flows).c.
                        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this->m_flows).c.
                        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
                 ((long)(this->m_flows).c.
                        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(this->m_flows).c.
                        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                 ((((ulong)((long)ppFVar3 -
                           (long)(this->m_flows).c.
                                 super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (ulong)(ppFVar3 == (_Map_pointer)0x0)) * 0x80);
      if ((this->m_flows).c.
          super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->m_flows).c.
          super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_a0.pIndent = PushIndentTo(this,(this->INPUT).m_mark.column,MAP);
        if (local_a0.pIndent != (IndentMarker *)0x0) {
          (local_a0.pIndent)->status = UNKNOWN;
          local_a0.pMapStart = (local_a0.pIndent)->pStartToken;
          (local_a0.pMapStart)->status = UNVERIFIED;
        }
      }
      local_70.mark.pos = (this->INPUT).m_mark.pos;
      local_70.mark.line = (this->INPUT).m_mark.line;
      local_70.mark.column = (this->INPUT).m_mark.column;
      paVar2 = &local_70.value.field_2;
      local_70.status = VALID;
      local_70.type = KEY;
      local_70.value._M_string_length = 0;
      local_70.value.field_2._M_local_buf[0] = '\0';
      local_70.params.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_70.params.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_70.params.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      local_70.params.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_70._76_8_ = 0;
      local_70.value._M_dataplus._M_p = (pointer)paVar2;
      std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
                (&(this->m_tokens).c,&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_70.params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.value._M_dataplus._M_p != paVar2) {
        operator_delete(local_70.value._M_dataplus._M_p);
      }
      pTVar6 = (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pTVar6 == (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pTVar6 = (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
      }
      local_a0.pKey = pTVar6 + -1;
      pTVar6[-1].status = UNVERIFIED;
      pSVar4 = (this->m_simpleKeys).c.
               super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar4 == (this->m_simpleKeys).c.
                    super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<YAML::Scanner::SimpleKey,std::allocator<YAML::Scanner::SimpleKey>>::
        _M_push_back_aux<YAML::Scanner::SimpleKey_const&>
                  ((deque<YAML::Scanner::SimpleKey,std::allocator<YAML::Scanner::SimpleKey>> *)
                   &this->m_simpleKeys,&local_a0);
      }
      else {
        pSVar4->pMapStart = local_a0.pMapStart;
        pSVar4->pKey = local_a0.pKey;
        pSVar4->flowLevel = local_a0.flowLevel;
        pSVar4->pIndent = local_a0.pIndent;
        (pSVar4->mark).pos = local_a0.mark.pos;
        (pSVar4->mark).line = local_a0.mark.line;
        *(undefined8 *)&(pSVar4->mark).column = local_a0._8_8_;
        piVar1 = &(this->m_simpleKeys).c.
                  super__Deque_base<YAML::Scanner::SimpleKey,_std::allocator<YAML::Scanner::SimpleKey>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
  }
  return;
}

Assistant:

bool Scanner::CanInsertPotentialSimpleKey() const {
  if (!m_simpleKeyAllowed)
    return false;

  return !ExistsActiveSimpleKey();
}